

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O3

int evutil_socket_(int domain,int type,int protocol)

{
  int iVar1;
  int fd;
  int iVar2;
  int iVar3;
  
  iVar1 = socket(domain,type,protocol);
  if ((((iVar1 < 0) && (iVar3 = -1, iVar1 = iVar3, (type & 0x80800U) != 0)) &&
      (fd = socket(domain,type & 0xfff7f7ff,protocol), -1 < fd)) &&
     (((((uint)type >> 0xb & 1) != 0 && (iVar1 = evutil_fast_socket_nonblocking(fd), iVar1 < 0)) ||
      ((iVar1 = fd, ((uint)type >> 0x13 & 1) != 0 &&
       (iVar2 = evutil_fast_socket_closeonexec(fd), iVar2 < 0)))))) {
    close(fd);
    iVar1 = iVar3;
  }
  return iVar1;
}

Assistant:

evutil_socket_t
evutil_socket_(int domain, int type, int protocol)
{
	evutil_socket_t r;
#if defined(SOCK_NONBLOCK) && defined(SOCK_CLOEXEC)
	r = socket(domain, type, protocol);
	if (r >= 0)
		return r;
	else if ((type & (SOCK_NONBLOCK|SOCK_CLOEXEC)) == 0)
		return -1;
#endif
#define SOCKET_TYPE_MASK (~(EVUTIL_SOCK_NONBLOCK|EVUTIL_SOCK_CLOEXEC))
	r = socket(domain, type & SOCKET_TYPE_MASK, protocol);
	if (r < 0)
		return -1;
	if (type & EVUTIL_SOCK_NONBLOCK) {
		if (evutil_fast_socket_nonblocking(r) < 0) {
			evutil_closesocket(r);
			return -1;
		}
	}
	if (type & EVUTIL_SOCK_CLOEXEC) {
		if (evutil_fast_socket_closeonexec(r) < 0) {
			evutil_closesocket(r);
			return -1;
		}
	}
	return r;
}